

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxpmhandler.cpp
# Opt level: O0

bool read_xpm_header(QIODevice *device,char **source,int *index,QByteArray *state,int *cpp,
                    int *ncols,int *w,int *h)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  QByteArray *in_RCX;
  int *in_RDX;
  char **in_RSI;
  QIODevice *in_RDI;
  int *in_R8;
  int *in_R9;
  long in_FS_OFFSET;
  int *in_stack_00000008;
  QByteArray buf;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  byte bVar4;
  QByteArray local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&local_20,200,'\0');
  bVar1 = read_xpm_string((QByteArray *)
                          CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),in_RDI,
                          in_RSI,in_RDX,in_RCX);
  if (bVar1) {
    pcVar3 = QByteArray::operator_cast_to_char_((QByteArray *)0x33547d);
    iVar2 = __isoc99_sscanf(pcVar3,"%d %d %d %d",in_stack_00000008,ncols,in_R9,in_R8);
    if (iVar2 < 4) {
      bVar4 = 0;
    }
    else if (((((*in_stack_00000008 < 1) || (0x7fff < *in_stack_00000008)) || (*ncols < 1)) ||
             ((0x7fff < *ncols || (*in_R9 < 1)))) ||
            ((0x1000000 < *in_R9 || ((*in_R8 < 1 || (0xf < *in_R8)))))) {
      bVar4 = 0;
    }
    else {
      bVar4 = 1;
    }
  }
  else {
    bVar4 = 0;
  }
  QByteArray::~QByteArray((QByteArray *)0x335535);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar4 & 1);
  }
  __stack_chk_fail();
}

Assistant:

static bool read_xpm_header(
    QIODevice *device, const char * const * source, int& index, QByteArray &state,
    int *cpp, int *ncols, int *w, int *h)
{
    QByteArray buf(200, 0);

    if (!read_xpm_string(buf, device, source, index, state))
        return false;

#ifdef Q_CC_MSVC
        if (sscanf_s(buf, "%d %d %d %d", w, h, ncols, cpp) < 4)
#else
    if (sscanf(buf, "%d %d %d %d", w, h, ncols, cpp) < 4)
#endif
        return false;                                        // < 4 numbers parsed

    if (*w <= 0 || *w > 32767 || *h <= 0 || *h > 32767 || *ncols <= 0 || *ncols > (64 * 64 * 64 * 64) || *cpp <= 0 || *cpp > 15)
        return false;                                        // failed sanity check

    return true;
}